

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int32_t zng_deflateParams(zng_stream *strm,int32_t level,int32_t strategy)

{
  deflate_state *pdVar1;
  int iVar2;
  int32_t iVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  int32_t iVar7;
  uint uVar8;
  bool bVar9;
  
  iVar2 = deflateStateCheck(strm);
  iVar7 = -2;
  if (iVar2 == 0) {
    uVar8 = 6;
    if (level != -1) {
      uVar8 = level;
    }
    if (((uint)strategy < 5 && uVar8 < 10) &&
       ((((pdVar1 = strm->state, pdVar1->strategy == strategy &&
          (configuration_table[pdVar1->level].func == configuration_table[uVar8].func)) ||
         (pdVar1->last_flush == -2)) ||
        (((iVar3 = zng_deflate(strm,5), iVar3 != -2 && (iVar7 = -5, strm->avail_in == 0)) &&
         ((pdVar1->strstart - pdVar1->block_start) + pdVar1->lookahead == 0)))))) {
      if (pdVar1->level != uVar8) {
        if ((pdVar1->level == 0) && (pdVar1->matches != 0)) {
          if (pdVar1->matches == 1) {
            (*functable.slide_hash)(pdVar1);
          }
          else {
            memset(pdVar1->head,0,0x20000);
          }
          pdVar1->matches = 0;
        }
        pdVar1->max_lazy_match = (uint)configuration_table[uVar8].max_lazy;
        pdVar1->good_match = (uint)configuration_table[uVar8].good_length;
        pdVar1->nice_match = (uint)configuration_table[uVar8].nice_length;
        bVar9 = 0x400 < configuration_table[uVar8].max_chain;
        pdVar1->max_chain_length = (uint)configuration_table[uVar8].max_chain;
        pcVar4 = update_hash;
        if (bVar9) {
          pcVar4 = update_hash_roll;
        }
        pcVar5 = insert_string;
        if (bVar9) {
          pcVar5 = insert_string_roll;
        }
        pcVar6 = quick_insert_string;
        if (bVar9) {
          pcVar6 = quick_insert_string_roll;
        }
        pdVar1->update_hash = pcVar4;
        pdVar1->insert_string = pcVar5;
        pdVar1->quick_insert_string = pcVar6;
        pdVar1->level = uVar8;
      }
      pdVar1->strategy = strategy;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateParams)(PREFIX3(stream) *strm, int32_t level, int32_t strategy) {
    deflate_state *s;
    compress_func func;
    int hook_flush = Z_NO_FLUSH;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

    if (level == Z_DEFAULT_COMPRESSION)
        level = 6;
    if (level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED)
        return Z_STREAM_ERROR;
    DEFLATE_PARAMS_HOOK(strm, level, strategy, &hook_flush);  /* hook for IBM Z DFLTCC */
    func = configuration_table[s->level].func;

    if (((strategy != s->strategy || func != configuration_table[level].func) && s->last_flush != -2)
        || hook_flush != Z_NO_FLUSH) {
        /* Flush the last buffer. Use Z_BLOCK mode, unless the hook requests a "stronger" one. */
        int flush = RANK(hook_flush) > RANK(Z_BLOCK) ? hook_flush : Z_BLOCK;
        int err = PREFIX(deflate)(strm, flush);
        if (err == Z_STREAM_ERROR)
            return err;
        if (strm->avail_in || ((int)s->strstart - s->block_start) + s->lookahead || !DEFLATE_DONE(strm, flush))
            return Z_BUF_ERROR;
    }
    if (s->level != level) {
        if (s->level == 0 && s->matches != 0) {
            if (s->matches == 1) {
                FUNCTABLE_CALL(slide_hash)(s);
            } else {
                CLEAR_HASH(s);
            }
            s->matches = 0;
        }

        lm_set_level(s, level);
    }
    s->strategy = strategy;
    return Z_OK;
}